

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O3

int session_headers_add_pad(nghttp2_session *session,nghttp2_frame *frame)

{
  uint uVar1;
  ulong uVar2;
  size_t sVar3;
  
  sVar3 = (frame->hd).length + 0x100;
  if (0x3fff < sVar3) {
    sVar3 = 0x4000;
  }
  uVar2 = session_call_select_padding(session,frame,sVar3);
  if (-0x385 < (int)uVar2) {
    sVar3 = uVar2 - (frame->hd).length;
    uVar1 = nghttp2_frame_add_pad(&(session->aob).framebufs,&frame->hd,sVar3,0);
    uVar2 = (ulong)uVar1;
    if (uVar1 == 0) {
      (frame->data).padlen = sVar3;
      uVar2 = 0;
    }
  }
  return (int)uVar2;
}

Assistant:

static int session_headers_add_pad(nghttp2_session *session,
                                   nghttp2_frame *frame) {
  int rv;
  ssize_t padded_payloadlen;
  nghttp2_active_outbound_item *aob;
  nghttp2_bufs *framebufs;
  size_t padlen;
  size_t max_payloadlen;

  aob = &session->aob;
  framebufs = &aob->framebufs;

  max_payloadlen = nghttp2_min(NGHTTP2_MAX_PAYLOADLEN,
                               frame->hd.length + NGHTTP2_MAX_PADLEN);

  padded_payloadlen =
      session_call_select_padding(session, frame, max_payloadlen);

  if (nghttp2_is_fatal((int)padded_payloadlen)) {
    return (int)padded_payloadlen;
  }

  padlen = (size_t)padded_payloadlen - frame->hd.length;

  DEBUGF("send: padding selected: payloadlen=%zd, padlen=%zu\n",
         padded_payloadlen, padlen);

  rv = nghttp2_frame_add_pad(framebufs, &frame->hd, padlen, 0);

  if (rv != 0) {
    return rv;
  }

  frame->headers.padlen = padlen;

  return 0;
}